

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O2

void __thiscall Imf_3_2::RgbaOutputFile::writePixels(RgbaOutputFile *this,int numScanLines)

{
  pthread_mutex_t *__mutex;
  lock_guard<std::mutex> lock;
  
  __mutex = (pthread_mutex_t *)this->_toYca;
  if (__mutex != (pthread_mutex_t *)0x0) {
    std::mutex::lock((mutex *)&__mutex->__data);
    ToYca::writePixels(this->_toYca,numScanLines);
    pthread_mutex_unlock(__mutex);
    return;
  }
  OutputFile::writePixels(this->_outputFile,numScanLines);
  return;
}

Assistant:

void
RgbaOutputFile::writePixels (int numScanLines)
{
    if (_toYca)
    {
        std::lock_guard<std::mutex> lock (*_toYca);
        _toYca->writePixels (numScanLines);
    }
    else
    {
        _outputFile->writePixels (numScanLines);
    }
}